

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapBase.h
# Opt level: O2

Index Eigen::internal::
      first_aligned_impl<16,_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_false>
      ::run(Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *m)

{
  PointerType pdVar1;
  ulong uVar2;
  ulong uVar3;
  
  pdVar1 = (m->
           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
           .m_data;
  uVar2 = (m->
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
          ).super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
          .m_cols.m_value;
  if (((ulong)pdVar1 & 7) != 0) {
    return uVar2;
  }
  uVar3 = (ulong)((uint)((ulong)pdVar1 >> 3) & 1);
  if ((long)uVar3 < (long)uVar2) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

EIGEN_DEVICE_FUNC inline const Scalar* data() const { return m_data; }